

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::Dynamic_Object_Constructor
          (Dynamic_Object_Constructor *this,string *t_type_name,Proxy_Function *t_func)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Type_Info *pTVar3;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  __last;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  element_type *peVar7;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  __first;
  allocator_type local_39;
  void *local_38 [2];
  long local_28;
  
  peVar7 = (t_func->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  pTVar3 = (peVar7->m_types).
           super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl
           .super__Vector_impl_data._M_start;
  __last._M_current =
       (peVar7->m_types).
       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
       super__Vector_impl_data._M_finish;
  __first._M_current = pTVar3 + 1;
  if (pTVar3 == __last._M_current) {
    __first._M_current = pTVar3;
  }
  std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>::
  vector<__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,void>
            ((vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>> *)local_38,__first
             ,__last,&local_39);
  Proxy_Function_Base::Proxy_Function_Base
            (&this->super_Proxy_Function_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_38,
             ((t_func->
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->m_arity + -1);
  if (local_38[0] != (void *)0x0) {
    operator_delete(local_38[0],local_28 - (long)local_38[0]);
  }
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Object_Constructor_003d54f0;
  paVar1 = &(this->m_type_name).field_2;
  (this->m_type_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (t_type_name->_M_dataplus)._M_p;
  paVar2 = &t_type_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar6 = *(undefined8 *)((long)&t_type_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_type_name).field_2 + 8) = uVar6;
  }
  else {
    (this->m_type_name)._M_dataplus._M_p = pcVar4;
    (this->m_type_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_type_name)._M_string_length = t_type_name->_M_string_length;
  (t_type_name->_M_dataplus)._M_p = (pointer)paVar2;
  t_type_name->_M_string_length = 0;
  (t_type_name->field_2)._M_local_buf[0] = '\0';
  peVar7 = (t_func->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  (this->m_func).
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar7;
  p_Var5 = (t_func->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->m_func).
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
      peVar7 = (t_func->
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  if (peVar7->m_arity != 0) {
    return;
  }
  __assert_fail("(t_func->get_arity() > 0 || t_func->get_arity() < 0) && \"Programming error, Dynamic_Object_Function must have at least one parameter (this)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/../dispatchkit/dynamic_object_detail.hpp"
                ,0x9f,
                "chaiscript::dispatch::detail::Dynamic_Object_Constructor::Dynamic_Object_Constructor(std::string, const Proxy_Function &)"
               );
}

Assistant:

Dynamic_Object_Constructor(std::string t_type_name, const Proxy_Function &t_func)
            : Proxy_Function_Base(build_type_list(t_func->get_param_types()), t_func->get_arity() - 1)
            , m_type_name(std::move(t_type_name))
            , m_func(t_func) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }